

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,true,false>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint uVar1;
  undefined4 left;
  undefined4 left_00;
  undefined4 left_01;
  unsigned_long *puVar2;
  timestamp_t tVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  int64_t *piVar7;
  ulong uVar8;
  idx_t iVar9;
  date_t lentry;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = ldata->days;
      local_68 = &rdata->micros;
      iVar9 = 0;
      iVar6 = count;
      do {
        left_01 = ((interval_t *)(local_68 + -1))->months;
        right_01.micros = iVar6;
        right_01._0_8_ = *local_68;
        tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)uVar1,(date_t)left_01,right_01);
        result_data[iVar9].value = tVar3.value;
        iVar9 = iVar9 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar11 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar2[uVar5];
      }
      uVar12 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar12 = count;
      }
      uVar4 = uVar12;
      if (uVar10 != 0) {
        uVar4 = uVar11;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar11 < uVar12) {
            uVar1 = ldata->days;
            piVar7 = &rdata[uVar11].micros;
            uVar10 = uVar5;
            do {
              left = ((interval_t *)(piVar7 + -1))->months;
              right.micros = uVar10;
              right._0_8_ = *piVar7;
              tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)uVar1,(date_t)left,right);
              result_data[uVar11].value = tVar3.value;
              uVar11 = uVar11 + 1;
              piVar7 = piVar7 + 2;
              uVar4 = uVar11;
            } while (uVar12 != uVar11);
          }
        }
        else if (uVar11 < uVar12) {
          piVar7 = &rdata[uVar11].micros;
          uVar8 = 0;
          uVar4 = uVar5;
          do {
            if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
              left_00 = ((interval_t *)(piVar7 + -1))->months;
              right_00.micros = uVar4;
              right_00._0_8_ = *piVar7;
              tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)(uint)ldata->days,(date_t)left_00,right_00);
              result_data[uVar11 + uVar8].value = tVar3.value;
            }
            uVar8 = uVar8 + 1;
            piVar7 = piVar7 + 2;
          } while ((uVar11 - uVar12) + uVar8 != 0);
          uVar4 = uVar11 + uVar8;
        }
      }
      uVar5 = uVar5 + 1;
      uVar11 = uVar4;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}